

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robotKuka.cpp
# Opt level: O2

void connection(string ip,uint port,bool *running_flag,RobotKuka *robotKuka)

{
  undefined8 *puVar1;
  Pose move;
  Axes rotate;
  DigitalOutputs DVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int __fd;
  int iVar15;
  uint uVar16;
  char *xml_send;
  ssize_t sVar17;
  long in_RCX;
  DigitalOutputs digout;
  socklen_t sendsize;
  int local_2d4;
  long local_2d0;
  deque<Pose,_std::allocator<Pose>_> *local_2c8;
  RobotKuka *local_2c0;
  Pose pose;
  sockaddr_in clientaddr;
  Axes axis;
  sockaddr local_230;
  string xml_receive;
  string local_138;
  Data data;
  
  local_2d0 = in_RCX;
  local_2c0 = robotKuka;
  __fd = socket(2,2,0);
  if (__fd < 0) {
    perror("socket failed");
  }
  local_230.sa_data[6] = '\0';
  local_230.sa_data[7] = '\0';
  local_230.sa_data[8] = '\0';
  local_230.sa_data[9] = '\0';
  local_230.sa_data[10] = '\0';
  local_230.sa_data[0xb] = '\0';
  local_230.sa_data[0xc] = '\0';
  local_230.sa_data[0xd] = '\0';
  local_230.sa_family = 2;
  local_230.sa_data._0_2_ = (ushort)running_flag << 8 | (ushort)running_flag >> 8;
  local_230.sa_data[2] = '\0';
  local_230.sa_data[3] = '\0';
  local_230.sa_data[4] = '\0';
  local_230.sa_data[5] = '\0';
  sendsize = 0x10;
  clientaddr.sin_family = 0;
  clientaddr.sin_port = 0;
  clientaddr.sin_addr.s_addr = 0;
  clientaddr.sin_zero[0] = '\0';
  clientaddr.sin_zero[1] = '\0';
  clientaddr.sin_zero[2] = '\0';
  clientaddr.sin_zero[3] = '\0';
  clientaddr.sin_zero[4] = '\0';
  clientaddr.sin_zero[5] = '\0';
  clientaddr.sin_zero[6] = '\0';
  clientaddr.sin_zero[7] = '\0';
  iVar15 = bind(__fd,&local_230,0x10);
  if (iVar15 < 0) {
    perror("bind failed");
  }
  local_2c8 = (deque<Pose,_std::allocator<Pose>_> *)(local_2d0 + 8);
  local_2d4 = __fd;
  do {
    if (*(char *)&local_2c0->CYCLE_TIME != '\x01') {
LAB_001063cd:
      close(__fd);
      pthread_exit((void *)0x0);
    }
    xml_send = (char *)malloc(0x800);
    sVar17 = recvfrom(__fd,xml_send,0x800,0,(sockaddr *)&clientaddr,&sendsize);
    uVar16 = (uint)sVar17;
    if ((int)uVar16 < 0) {
      perror("recvfrom failed");
      goto LAB_001063cd;
    }
    xml_send[uVar16 & 0x7fffffff] = '\0';
    Data::Data(&data);
    xml_handler::get_data_from_xml_send((Data *)&xml_receive,xml_send,uVar16);
    memcpy(&data,(Data *)&xml_receive,0xe4);
    xml_receive._M_dataplus._M_p = (pointer)&xml_receive.field_2;
    xml_receive._M_string_length = 0;
    xml_receive.field_2._M_local_buf[0] = '\0';
    Pose::Pose(&pose);
    Axes::Axes(&axis);
    DigitalOutputs::DigitalOutputs(&digout);
    puVar1 = *(undefined8 **)(local_2d0 + 0x18);
    if (*(undefined8 **)(local_2d0 + 0x38) != puVar1) {
      pose._16_8_ = puVar1[2];
      pose._0_8_ = *puVar1;
      pose._8_8_ = puVar1[1];
      std::deque<Pose,_std::allocator<Pose>_>::pop_front(local_2c8);
    }
    uVar13 = axis._16_8_;
    uVar11 = axis._8_8_;
    uVar9 = axis._0_8_;
    uVar7 = pose._16_8_;
    uVar5 = pose._8_8_;
    uVar3 = pose._0_8_;
    DVar2 = digout;
    uVar16 = Data::get_ipoc(&data);
    uVar14 = axis._16_8_;
    uVar12 = axis._8_8_;
    uVar10 = axis._0_8_;
    uVar8 = pose._16_8_;
    uVar6 = pose._8_8_;
    uVar4 = pose._0_8_;
    pose.z = (float)uVar5;
    pose.a = SUB84(uVar5,4);
    move.z = pose.z;
    move.a = pose.a;
    pose.x = (float)uVar3;
    pose.y = SUB84(uVar3,4);
    move.x = pose.x;
    move.y = pose.y;
    pose.b = (float)uVar7;
    pose.c = SUB84(uVar7,4);
    move.b = pose.b;
    move.c = pose.c;
    axis.a3 = (float)uVar11;
    axis.a4 = SUB84(uVar11,4);
    rotate.a3 = axis.a3;
    rotate.a4 = axis.a4;
    axis.a1 = (float)uVar9;
    axis.a2 = SUB84(uVar9,4);
    rotate.a1 = axis.a1;
    rotate.a2 = axis.a2;
    axis.a5 = (float)uVar13;
    axis.a6 = SUB84(uVar13,4);
    rotate.a5 = axis.a5;
    rotate.a6 = axis.a6;
    pose._0_8_ = uVar4;
    pose._8_8_ = uVar6;
    pose._16_8_ = uVar8;
    axis._0_8_ = uVar10;
    axis._8_8_ = uVar12;
    axis._16_8_ = uVar14;
    xml_handler::generate_xml_receive_abi_cxx11_
              (&local_138,(xml_handler *)(ulong)(uint3)DVar2,move,rotate,SUB43(uVar16,0),
               (uint)(float)uVar7);
    std::__cxx11::string::operator=((string *)&xml_receive,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    __fd = local_2d4;
    sendto(local_2d4,xml_receive._M_dataplus._M_p,xml_receive._M_string_length,0,
           (sockaddr *)&clientaddr,sendsize);
    free(xml_send);
    std::__cxx11::string::~string((string *)&xml_receive);
  } while( true );
}

Assistant:

void connection(std::string ip, unsigned int port, bool* running_flag, RobotKuka* robotKuka)
{	
	#define EXPR_SIZE   2048
	#define BUFLEN      2048
	#define TRUE        1
	#define SERVERLEN   2048

	int fd;

    if ((fd = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
        perror( "socket failed" );
    }

    struct sockaddr_in serveraddr;
    memset( &serveraddr, 0, sizeof(serveraddr) );
    serveraddr.sin_family = AF_INET;
    serveraddr.sin_port = htons( port );
    serveraddr.sin_addr.s_addr = htonl( INADDR_ANY );

	struct sockaddr_in clientaddr;
    socklen_t sendsize = sizeof(clientaddr);
	bzero(&clientaddr, sizeof(clientaddr));


    if (bind(fd, (struct sockaddr *)&serveraddr, sizeof(serveraddr)) < 0) {
        perror( "bind failed" );
    }


	while (*running_flag)
	{
		char* xml_send = (char*)malloc(sizeof(char) * 2048);

		int length = recvfrom(fd, xml_send, sizeof(char) * 2048 , 0, (struct sockaddr *) &clientaddr, &sendsize );
        if ( length < 0 ) {
            perror( "recvfrom failed" );
            break;
        }

        /* Starts chrono to account CYCLE TIME */
		//auto started = std::chrono::high_resolution_clock::now();

		//std::cout << "Msg len: " << length << std::endl;

		xml_send[length] = '\0';  // This is necessary to avoid xml_parse errors;

		/* Gets all data read from received XML Send and puts it into a instance of Data. */
		Data data;
		data = xml_handler::get_data_from_xml_send(const_cast<char*>(xml_send), length);

		//data.get_r_ist().print();
		//std::cout << data.get_delay() << std::endl;

		//data.print();

		std::string xml_receive;  // creates string for XML Receive

		/* Creates void instances of pose, axis and digital outputs to send thru XML Receive. */
		Pose pose = Pose();
		Axes axis = Axes();
		DigitalOutputs digout = DigitalOutputs();

		/* Push one element from the queue if the movement queue is not empty. If the queue is empty,
		the void instances are placed. */
		if (!robotKuka->move_queue.empty())
		{
			pose = robotKuka->move_queue.front();
			robotKuka->move_queue.pop();
		}

		/* Generates the XML Receive string using the pose, axis, and digital outputs instances and
		the previous XML Send IPOC value. */
    	xml_receive = xml_handler::generate_xml_receive(pose, axis, digout, data.get_ipoc());

    	/* Sends the XML Receive string thru the socket created previously. */
		int send_status = sendto(fd, xml_receive.c_str(), xml_receive.length()*sizeof(char), 0, (struct sockaddr *) &clientaddr, 
								 sendsize);

		/* Free the allocated space for XML Send string. */
		free(xml_send);  // might be a bottleneck <!>

		/* Stops chrono to account CYCLE TIME. */
		//auto done = std::chrono::high_resolution_clock::now();
		//std::cout << "Time: " << std::chrono::duration_cast<std::chrono::nanoseconds>(done-started).count();
	}


	/* Closes the previously openned communication socket. */
    close(fd);

    /* Exits the previously created communication thread. */
	pthread_exit(NULL);
	exit(0);
}